

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalFileLog.cpp
# Opt level: O0

void ApprovalFileLog::initialize(void)

{
  string *in_stack_000001d8;
  string *in_stack_000001e0;
  allocator local_41;
  string local_40 [32];
  string local_20 [32];
  
  if (!initialize::isInitialized) {
    initialize::isInitialized = true;
    getLogFilePath_abi_cxx11_();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"",&local_41);
    ApprovalTests::FileUtils::writeToFile(in_stack_000001e0,in_stack_000001d8);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    std::__cxx11::string::~string(local_20);
  }
  return;
}

Assistant:

void ApprovalFileLog::initialize()
{
    static bool isInitialized{false};
    if (isInitialized)
    {
        return;
    }
    isInitialized = true;
    ApprovalTests::FileUtils::writeToFile(getLogFilePath(), "");
}